

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

int KillAll(PClassActor *cls)

{
  int iVar1;
  uint uVar2;
  DThinker *pDVar3;
  undefined4 extraout_var;
  int iVar5;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator FStack_38;
  PClassActor *pPVar4;
  
  FThinkerIterator::FThinkerIterator(&FStack_38,&cls->super_PClass,0x80);
  pDVar3 = FThinkerIterator::Next(&FStack_38);
  if (pDVar3 == (DThinker *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      pPVar4 = (PClassActor *)(pDVar3->super_DObject).Class;
      if (pPVar4 == (PClassActor *)0x0) {
        iVar1 = (**(pDVar3->super_DObject)._vptr_DObject)(pDVar3);
        pPVar4 = (PClassActor *)CONCAT44(extraout_var,iVar1);
        (pDVar3->super_DObject).Class = (PClass *)pPVar4;
      }
      if (((pPVar4 == cls) && (((ulong)pDVar3[7].super_DObject.Class & 0x10000000) == 0)) &&
         (((ulong)pDVar3[7].super_DObject.Class & 0x200000000000) != 0)) {
        uVar2 = (*(pDVar3->super_DObject)._vptr_DObject[0x1f])(pDVar3);
        iVar5 = iVar5 + (uVar2 & 0xff);
      }
      pDVar3 = FThinkerIterator::Next(&FStack_38);
    } while (pDVar3 != (DThinker *)0x0);
  }
  return iVar5;
}

Assistant:

static int KillAll(PClassActor *cls)
{
	AActor *actor;
	int killcount = 0;
	TThinkerIterator<AActor> iterator(cls);
	while ( (actor = iterator.Next ()) )
	{
		if (actor->IsA(cls))
		{
			if (!(actor->flags2 & MF2_DORMANT) && (actor->flags3 & MF3_ISMONSTER))
					killcount += actor->Massacre ();
		}
	}
	return killcount;

}